

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas3_d.cpp
# Opt level: O3

void dtrsm(char side,char uplo,char transa,char diag,int m,int n,double alpha,double *a,int lda,
          double *b,int ldb)

{
  char ca;
  char ca_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  double *pdVar8;
  undefined7 in_register_00000039;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  double *pdVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  string local_90;
  undefined4 local_70;
  undefined4 uStack_6c;
  double local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  char local_49;
  bool local_48;
  undefined7 uStack_47;
  ulong local_40;
  uint local_38;
  char local_31;
  
  _local_58 = CONCAT44(uStack_54,(int)CONCAT71(in_register_00000011,transa));
  _local_60 = CONCAT44(uStack_5c,(int)CONCAT71(in_register_00000039,side));
  local_68 = alpha;
  bVar1 = lsame(side,'L');
  _local_70 = CONCAT44(uStack_6c,(int)CONCAT71(in_register_00000009,diag));
  local_31 = lsame(diag,'N');
  bVar2 = lsame(uplo,'U');
  _local_48 = CONCAT71(uStack_47,bVar2);
  local_49 = bVar1;
  local_40 = (ulong)(uint)n;
  local_38 = m;
  if (!bVar1) {
    bVar1 = lsame((char)local_60,'R');
    iVar15 = 1;
    m = n;
    if (!bVar1) goto LAB_002160fd;
  }
  if (local_48 == false) {
    bVar1 = lsame(uplo,'L');
    iVar15 = 2;
    if (!bVar1) goto LAB_002160fd;
  }
  ca_00 = (char)local_58;
  bVar1 = lsame((char)local_58,'N');
  if ((!bVar1) && (bVar1 = lsame(ca_00,'T'), !bVar1)) {
    bVar1 = lsame(ca_00,'C');
    iVar15 = 3;
    if (!bVar1) goto LAB_002160fd;
  }
  ca = (char)local_70;
  bVar1 = lsame((char)local_70,'U');
  if (!bVar1) {
    bVar1 = lsame(ca,'N');
    iVar15 = 4;
    if (!bVar1) goto LAB_002160fd;
  }
  if ((int)local_38 < 0) {
    iVar15 = 5;
  }
  else if ((int)local_40 < 0) {
    iVar15 = 6;
  }
  else {
    iVar3 = i4_max(1,m);
    iVar15 = 9;
    if (iVar3 <= lda) {
      iVar3 = i4_max(1,local_38);
      iVar15 = 0xb;
      if (iVar3 <= ldb) {
        if ((int)local_40 == 0) {
          return;
        }
        if ((local_68 == 0.0) && (!NAN(local_68))) {
          uVar7 = (ulong)local_38;
          uVar12 = local_40 & 0xffffffff;
          iVar15 = 0;
          do {
            if (local_38 != 0) {
              memset(b + iVar15,0,uVar7 << 3);
            }
            iVar15 = iVar15 + ldb;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
          return;
        }
        bVar1 = lsame(ca_00,'N');
        if (local_49 == '\0') {
          uVar7 = (ulong)local_38;
          if (!bVar1) {
            lVar5 = (long)ldb;
            uVar12 = local_40 & 0xffffffff;
            if (local_48 != false) {
              uVar4 = (ulong)((int)local_40 - 1);
              pdVar9 = b + (uVar12 - 1) * lVar5;
              do {
                uVar13 = uVar12 - 1;
                if ((local_31 != '\0') && (local_38 != 0)) {
                  dVar17 = a[(lda + 1) * (int)uVar13];
                  uVar6 = 0;
                  do {
                    pdVar9[uVar6] = pdVar9[uVar6] * (1.0 / dVar17);
                    uVar6 = uVar6 + 1;
                  } while (uVar7 != uVar6);
                }
                if (1 < (long)uVar12) {
                  uVar6 = 0;
                  pdVar8 = b;
                  do {
                    dVar17 = a[uVar13 * (long)lda + uVar6];
                    if (dVar17 != 0.0 && local_38 != 0) {
                      uVar10 = 0;
                      do {
                        pdVar8[uVar10] = pdVar9[uVar10] * -dVar17 + pdVar8[uVar10];
                        uVar10 = uVar10 + 1;
                      } while (uVar7 != uVar10);
                    }
                    uVar6 = uVar6 + 1;
                    pdVar8 = pdVar8 + lVar5;
                  } while (uVar6 != uVar4);
                }
                if (local_38 != 0 && local_68 != 1.0) {
                  uVar6 = 0;
                  do {
                    pdVar9[uVar6] = pdVar9[uVar6] * local_68;
                    uVar6 = uVar6 + 1;
                  } while (uVar7 != uVar6);
                }
                uVar4 = uVar4 - 1;
                pdVar9 = pdVar9 + -lVar5;
                bVar1 = 1 < (long)uVar12;
                uVar12 = uVar13;
              } while (bVar1);
              return;
            }
            pdVar9 = b + lVar5;
            uVar13 = 1;
            uVar4 = 0;
            do {
              if ((local_31 != '\0') && (local_38 != 0)) {
                dVar17 = a[(lda + 1) * (int)uVar4];
                uVar6 = 0;
                do {
                  b[uVar6] = b[uVar6] * (1.0 / dVar17);
                  uVar6 = uVar6 + 1;
                } while (uVar7 != uVar6);
              }
              uVar6 = uVar4 + 1;
              if (uVar6 < uVar12) {
                uVar10 = uVar13;
                pdVar8 = pdVar9;
                do {
                  dVar17 = a[uVar4 * (long)lda + uVar10];
                  if (dVar17 != 0.0 && local_38 != 0) {
                    uVar16 = 0;
                    do {
                      pdVar8[uVar16] = b[uVar16] * -dVar17 + pdVar8[uVar16];
                      uVar16 = uVar16 + 1;
                    } while (uVar7 != uVar16);
                  }
                  uVar10 = uVar10 + 1;
                  pdVar8 = pdVar8 + lVar5;
                } while (uVar10 != uVar12);
              }
              if (local_38 != 0 && local_68 != 1.0) {
                uVar4 = 0;
                do {
                  b[uVar4] = b[uVar4] * local_68;
                  uVar4 = uVar4 + 1;
                } while (uVar7 != uVar4);
              }
              uVar13 = uVar13 + 1;
              b = b + lVar5;
              pdVar9 = pdVar9 + lVar5;
              uVar4 = uVar6;
            } while (uVar6 != uVar12);
            return;
          }
          if (local_48 != false) {
            uVar12 = 0;
            pdVar9 = b;
            do {
              if (local_68 != 1.0 && local_38 != 0) {
                uVar4 = 0;
                do {
                  pdVar9[uVar4] = pdVar9[uVar4] * local_68;
                  uVar4 = uVar4 + 1;
                } while (uVar7 != uVar4);
              }
              if (uVar12 != 0) {
                uVar4 = 0;
                pdVar8 = b;
                do {
                  if (a[uVar12 * (long)lda + uVar4] != 0.0 && local_38 != 0) {
                    uVar13 = 0;
                    do {
                      pdVar9[uVar13] =
                           pdVar9[uVar13] - a[uVar12 * (long)lda + uVar4] * pdVar8[uVar13];
                      uVar13 = uVar13 + 1;
                    } while (uVar7 != uVar13);
                  }
                  uVar4 = uVar4 + 1;
                  pdVar8 = pdVar8 + ldb;
                } while (uVar4 != uVar12);
              }
              if ((local_31 != '\0') && (local_38 != 0)) {
                dVar17 = a[(lda + 1) * (int)uVar12];
                uVar4 = 0;
                do {
                  pdVar9[uVar4] = pdVar9[uVar4] * (1.0 / dVar17);
                  uVar4 = uVar4 + 1;
                } while (uVar7 != uVar4);
              }
              uVar12 = uVar12 + 1;
              pdVar9 = pdVar9 + ldb;
            } while (uVar12 != (local_40 & 0xffffffff));
            return;
          }
          uVar4 = local_40 & 0xffffffff;
          lVar5 = (long)ldb;
          pdVar9 = b + (uVar4 - 1) * lVar5;
          pdVar8 = b + lVar5 * uVar4;
          uVar12 = uVar4;
          do {
            if (local_68 != 1.0 && local_38 != 0) {
              uVar13 = 0;
              do {
                pdVar9[uVar13] = pdVar9[uVar13] * local_68;
                uVar13 = uVar13 + 1;
              } while (uVar7 != uVar13);
            }
            uVar13 = uVar12 - 1;
            if ((long)uVar12 < (long)uVar4) {
              pdVar14 = pdVar8;
              uVar6 = uVar12;
              do {
                if (a[uVar13 * (long)lda + uVar6] != 0.0 && local_38 != 0) {
                  uVar10 = 0;
                  do {
                    pdVar9[uVar10] =
                         pdVar9[uVar10] - a[uVar13 * (long)lda + uVar6] * pdVar14[uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar7 != uVar10);
                }
                uVar6 = uVar6 + 1;
                pdVar14 = pdVar14 + lVar5;
              } while ((int)uVar6 != (int)local_40);
            }
            if ((local_31 != '\0') && (local_38 != 0)) {
              dVar17 = a[(lda + 1) * (int)uVar13];
              uVar6 = 0;
              do {
                pdVar9[uVar6] = pdVar9[uVar6] * (1.0 / dVar17);
                uVar6 = uVar6 + 1;
              } while (uVar7 != uVar6);
            }
            pdVar9 = pdVar9 + -lVar5;
            pdVar8 = pdVar8 + -lVar5;
            bVar1 = 1 < (long)uVar12;
            uVar12 = uVar13;
          } while (bVar1);
          return;
        }
        if (!bVar1) {
          if (local_48 != false) {
            uVar7 = 0;
            pdVar9 = b;
            do {
              if (local_38 != 0) {
                lVar5 = uVar7 * (long)ldb;
                uVar12 = 0;
                pdVar8 = a;
                do {
                  dVar17 = b[lVar5 + uVar12] * local_68;
                  if (uVar12 != 0) {
                    uVar4 = 0;
                    do {
                      dVar17 = dVar17 - pdVar8[uVar4] * pdVar9[uVar4];
                      uVar4 = uVar4 + 1;
                    } while (uVar12 != uVar4);
                  }
                  if (local_31 != '\0') {
                    dVar17 = dVar17 / a[(lda + 1) * (int)uVar12];
                  }
                  b[lVar5 + uVar12] = dVar17;
                  uVar12 = uVar12 + 1;
                  pdVar8 = pdVar8 + lda;
                } while (uVar12 != local_38);
              }
              uVar7 = uVar7 + 1;
              pdVar9 = pdVar9 + ldb;
            } while (uVar7 != (local_40 & 0xffffffff));
            return;
          }
          uVar7 = (ulong)local_38;
          pdVar9 = b + uVar7;
          uVar12 = 0;
          do {
            if (local_38 != 0) {
              lVar5 = uVar12 * (long)ldb;
              iVar15 = 0;
              uVar4 = uVar7;
              pdVar8 = a + (uVar7 - 1) * (long)lda + uVar7;
              pdVar14 = pdVar9;
              do {
                dVar17 = b[lVar5 + (uVar4 - 1)] * local_68;
                if ((long)uVar4 < (long)uVar7) {
                  lVar11 = 0;
                  do {
                    dVar17 = dVar17 - pdVar8[lVar11] * pdVar14[lVar11];
                    lVar11 = lVar11 + 1;
                  } while (iVar15 != (int)lVar11);
                }
                uVar13 = uVar4 - 1;
                if (local_31 != '\0') {
                  dVar17 = dVar17 / a[(lda + 1) * (int)uVar13];
                }
                b[lVar5 + uVar13] = dVar17;
                pdVar14 = pdVar14 + -1;
                pdVar8 = pdVar8 + ~(long)lda;
                iVar15 = iVar15 + 1;
                bVar1 = 1 < (long)uVar4;
                uVar4 = uVar13;
              } while (bVar1);
            }
            uVar12 = uVar12 + 1;
            pdVar9 = pdVar9 + ldb;
          } while (uVar12 != (local_40 & 0xffffffff));
          return;
        }
        if (local_48 == false) {
          uVar7 = (ulong)local_38;
          uVar12 = 0;
          pdVar9 = b;
          do {
            if (local_68 != 1.0 && local_38 != 0) {
              uVar4 = 0;
              do {
                pdVar9[uVar4] = pdVar9[uVar4] * local_68;
                uVar4 = uVar4 + 1;
              } while (uVar7 != uVar4);
            }
            if (local_38 != 0) {
              lVar5 = uVar12 * (long)ldb;
              uVar13 = 0;
              pdVar8 = a;
              pdVar14 = pdVar9;
              uVar4 = uVar7;
              do {
                dVar17 = b[lVar5 + uVar13];
                if ((dVar17 != 0.0) || (NAN(dVar17))) {
                  if (local_31 != '\0') {
                    b[lVar5 + uVar13] = dVar17 / a[(lda + 1) * (int)uVar13];
                  }
                  if ((long)(uVar13 + 1) < (long)uVar7) {
                    uVar6 = 1;
                    do {
                      pdVar14[uVar6] =
                           pdVar14[uVar6] -
                           b[lVar5 + uVar13] *
                           *(double *)((long)pdVar8 + uVar6 * 8 + (long)lda * 8 * uVar13);
                      uVar6 = uVar6 + 1;
                    } while (uVar4 != uVar6);
                  }
                }
                uVar13 = uVar13 + 1;
                pdVar8 = pdVar8 + 1;
                pdVar14 = pdVar14 + 1;
                uVar4 = uVar4 - 1;
              } while (uVar13 != uVar7);
            }
            uVar12 = uVar12 + 1;
            pdVar9 = pdVar9 + ldb;
          } while (uVar12 != (local_40 & 0xffffffff));
          return;
        }
        uVar12 = (ulong)local_38;
        uVar7 = 0;
        pdVar9 = b;
        do {
          if (local_68 != 1.0 && local_38 != 0) {
            uVar4 = 0;
            do {
              pdVar9[uVar4] = pdVar9[uVar4] * local_68;
              uVar4 = uVar4 + 1;
            } while (uVar12 != uVar4);
          }
          if (local_38 != 0) {
            lVar5 = uVar7 * (long)ldb;
            uVar4 = (ulong)(local_38 - 1);
            uVar13 = uVar12;
            pdVar8 = a + (uVar12 - 1) * (long)lda;
            do {
              uVar6 = uVar13 - 1;
              dVar17 = b[lVar5 + (uVar13 - 1)];
              if ((dVar17 != 0.0) || (NAN(dVar17))) {
                if (local_31 != '\0') {
                  b[lVar5 + uVar6] = dVar17 / a[(lda + 1) * (int)uVar6];
                }
                if ((long)uVar13 < 2) break;
                uVar10 = 0;
                do {
                  pdVar9[uVar10] = pdVar9[uVar10] - b[lVar5 + uVar6] * pdVar8[uVar10];
                  uVar10 = uVar10 + 1;
                } while (uVar4 != uVar10);
              }
              uVar4 = uVar4 - 1;
              pdVar8 = pdVar8 + -(long)lda;
              bVar1 = 1 < (long)uVar13;
              uVar13 = uVar6;
            } while (bVar1);
          }
          uVar7 = uVar7 + 1;
          pdVar9 = pdVar9 + ldb;
          if (uVar7 == (local_40 & 0xffffffff)) {
            return;
          }
        } while( true );
      }
    }
  }
LAB_002160fd:
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"DTRSM","");
  xerbla(&local_90,iVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void dtrsm ( char side, char uplo, char transa, char diag, int m, int n, 
  double alpha, double a[], int lda, double b[], int ldb )

//****************************************************************************80
//
//  Purpose:
//
//    DTRSM solves A*X=alpha*B or X*A=alpha*B, for triangular A, rectangular B.
//
//  Discussion:
//
//    DTRSM solves one of the matrix equations
//      op( A )*X = alpha*B,   
//    or
//      X*op( A ) = alpha*B,
//    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
//    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of
//      op( A ) = A   or   op( A ) = A'.
//    The matrix X is overwritten on B.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    07 April 2014
//
//  Author:
//
//    This C++ version by John Burkardt.
//
//  Parameters:
//
//    Input, char SIDE, specifies whether op( A ) appears on the left
//    or right of X as follows:
//    'L' or 'l': op( A )*X = alpha*B.
//    'R' or 'r': X*op( A ) = alpha*B.
//
//    Input, char UPLO, specifies whether the matrix A is an upper or
//    lower triangular matrix as follows:
//    'U' or 'u': A is an upper triangular matrix.
//    'L' or 'l': A is a lower triangular matrix.
//
//    Input, char TRANSA, specifies the form of op( A ) to be used in
//    the matrix multiplication as follows:
//    'N' or 'n': op( A ) = A.
//    'T' or 't': op( A ) = A'.
//    'C' or 'c': op( A ) = A'.
//
//    Input, char DIAG, specifies whether or not A is unit triangular
//    as follows:
//    'U' or 'u': A is assumed to be unit triangular.
//    'N' or 'n': A is not assumed to be unit triangular.
//
//    Input, int M, the number of rows of B.  0 <= M.
//
//    Input, int N, the number of columns of B.  0 <= N.
//
//    Input, double ALPHA, the scalar alpha.  When alpha is
//    0.0 then A is not referenced and B need not be set before entry.
//
//    Input, double A[LDA*K] where K is M when SIDE = 'L' or 'l'  
//    and K is N when SIDE = 'R' or 'r'.
//    Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
//    upper triangular part of the array  A must contain the upper
//    triangular matrix  and the strictly lower triangular part of
//    A is not referenced.
//    Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
//    lower triangular part of the array  A must contain the lower
//    triangular matrix  and the strictly upper triangular part of
//    A is not referenced.
//    Note that when  DIAG = 'U' or 'u',  the diagonal elements of
//    A  are not referenced either,  but are assumed to be  unity.
//
//    Input, int LDA, the first dimension of A as declared
//    in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
//    LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
//    then LDA must be at least max( 1, n ).
//
//    Input/output, double B[LDB*N].
//    Before entry, the leading m by n part of the array B must
//    contain the right-hand side matrix B, and on exit is
//    overwritten by the solution matrix X.
//
//    Input, int LDB, the first dimension of B as declared
//    in the calling program.  LDB must be at least max ( 1, M ).
//
{
  int i;
  int info;
  int j;
  int k;
  bool lside;
  bool nounit;
  int nrowa;
  double temp;
  bool upper;
//
//  Test the input parameters.
//
  lside = lsame ( side, 'L' );

  if ( lside )
  {
    nrowa = m;
  }
  else
  {
    nrowa = n;
  }

  nounit = lsame ( diag, 'N' );
  upper = lsame ( uplo, 'U' );

  info = 0;

  if ( ( ! lside ) && ( ! lsame ( side, 'R' ) ) )
  {
    info = 1;
  }
  else if ( ( ! upper ) && ( ! lsame ( uplo, 'L' ) ) )
  {
    info = 2;
  }
  else if ( ( ! lsame ( transa, 'N' ) ) && 
            ( ! lsame ( transa, 'T' ) ) && 
            ( ! lsame ( transa, 'C' ) ) )
  {
    info = 3;
  }
  else if ( ( ! lsame ( diag, 'U' ) ) && ( ! lsame ( diag, 'N' ) ) )
  {
    info = 4;
  }
  else if ( m < 0 )
  {
    info = 5;
  }
  else if ( n < 0 )
  {
    info = 6;
  }
  else if ( lda < i4_max ( 1, nrowa ) )
  {
    info = 9;
  }
  else if ( ldb < i4_max ( 1, m ) )
  {
    info = 11;
  }

  if ( info != 0 ) 
  {
    xerbla ( "DTRSM", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( n == 0 )
  {
    return;
  }
//
//  and when alpha is 0.0.
//
  if ( alpha == 0.0 )
  {
    for ( j = 0; j < n; j++ )
    {
      for ( i = 0; i < m; i++ )
      {
        b[i+j*ldb] = 0.0;
      }
    }
    return;
  }
//
//  Start the operations.
//
  if ( lside ) 
  {
//
//  Form  B := alpha*inv( a )*B.
//
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = m - 1; 0 <= k; k-- )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = 0; i < k; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < m; k++ )
          {
            if ( b[k+j*ldb] != 0.0 )
            {
              if ( nounit )
              {
                b[k+j*ldb] = b[k+j*ldb] / a[k+k*lda];
              }
              for ( i = k + 1; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - b[k+j*ldb] * a[i+k*lda];
              }
            }
          }
        }
      }
    }
//
//  Form  B := alpha*inv( A' )*B.
//
    else
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = 0; i < m; i++ )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = 0; k < i; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
      else
      {
        for ( j = 0; j < n; j++ )
        {
          for ( i = m - 1; 0 <= i; i-- )
          {
            temp = alpha * b[i+j*ldb];
            for ( k = i + 1; k < m; k++ )
            {
              temp = temp - a[k+i*lda] * b[k+j*ldb];
            }
            if ( nounit )
            {
              temp = temp / a[i+i*lda];
            }
            b[i+j*ldb] = temp;
          }
        }
      }
    }
  }
//
//  Form  B := alpha*B*inv( A ).
//
  else
  {
    if ( lsame ( transa, 'N' ) )
    {
      if ( upper )
      {
        for ( j = 0; j < n; j++ )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = 0; k < j; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
      else
      {
        for ( j = n - 1; 0 <= j; j-- )
        {
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = alpha * b[i+j*ldb];
            }
          }
          for ( k = j + 1; k < n; k++ )
          {
            if ( a[k+j*lda] != 0.0 )
            {
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - a[k+j*lda] * b[i+k*ldb];
              }
            }
          }
          if ( nounit )
          {
            temp = 1.0 / a[j+j*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+j*ldb] = temp * b[i+j*ldb];
            }
          }
        }
      }
    }
//
//  Form  B := alpha*B*inv( A' ).
//
    else
    {
      if ( upper )
      {
        for ( k = n - 1; 0 <= k; k-- )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = 0; j < k; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
      else
      {
        for ( k = 0; k < n; k++ )
        {
          if ( nounit )
          {
            temp = 1.0 / a[k+k*lda];
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = temp * b[i+k*ldb];
            }
          }
          for ( j = k + 1; j < n; j++ )
          {
            if ( a[j+k*lda] != 0.0 )
            {
              temp = a[j+k*lda];
              for ( i = 0; i < m; i++ )
              {
                b[i+j*ldb] = b[i+j*ldb] - temp * b[i+k*ldb];
              }
            }
          }
          if ( alpha != 1.0 )
          {
            for ( i = 0; i < m; i++ )
            {
              b[i+k*ldb] = alpha * b[i+k*ldb];
            }
          }
        }
      }
    }
  }
  return;
}